

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>
::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *columns,Characteristic characteristic)

{
  Column_settings *colSettings;
  
  colSettings = (Column_settings *)operator_new(0x38);
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.ptr = (char *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.sz = 0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x30;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  *(Column_settings **)this = colSettings;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
              *)(this + 8),columns,colSettings);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::Matrix(const std::vector<Container>& columns,
                                                Characteristic characteristic)
    : colSettings_(new Column_settings(characteristic)),
      matrix_(columns, colSettings_)
{
  static_assert(PersistenceMatrixOptions::is_of_boundary_type || !PersistenceMatrixOptions::has_vine_update ||
                    PersistenceMatrixOptions::has_column_pairings,
                "When no barcode is recorded with vine swaps for chain matrices, comparison functions for the columns "
                "have to be provided.");
  _assert_options();
}